

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O3

void av1_free_pc_tree_recursive
               (PC_TREE *pc_tree,int num_planes,int keep_best,int keep_none,
               PARTITION_SEARCH_TYPE partition_search_type)

{
  PARTITION_TYPE PVar1;
  bool bVar2;
  long lVar3;
  int i;
  int i_1;
  bool bVar4;
  
  if (pc_tree == (PC_TREE *)0x0) {
    return;
  }
  if ((keep_none == 0 && keep_best == 0) && partition_search_type == '\x02') {
    av1_free_pmc(pc_tree->none,num_planes);
    lVar3 = 0;
    pc_tree->none = (PICK_MODE_CONTEXT *)0x0;
    av1_free_pmc(pc_tree->horizontal[0],num_planes);
    pc_tree->horizontal[0] = (PICK_MODE_CONTEXT *)0x0;
    av1_free_pmc(pc_tree->vertical[0],num_planes);
    pc_tree->vertical[0] = (PICK_MODE_CONTEXT *)0x0;
    av1_free_pmc(pc_tree->horizontal[1],num_planes);
    pc_tree->horizontal[1] = (PICK_MODE_CONTEXT *)0x0;
    av1_free_pmc(pc_tree->vertical[1],num_planes);
    pc_tree->vertical[1] = (PICK_MODE_CONTEXT *)0x0;
    do {
      if (pc_tree->split[lVar3] != (PC_TREE *)0x0) {
        av1_free_pc_tree_recursive(pc_tree->split[lVar3],num_planes,0,0,'\x02');
        pc_tree->split[lVar3] = (PC_TREE *)0x0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
  }
  else {
    PVar1 = pc_tree->partitioning;
    if ((keep_none == 0) && (PVar1 != '\0' || keep_best == 0)) {
      av1_free_pmc(pc_tree->none,num_planes);
      pc_tree->none = (PICK_MODE_CONTEXT *)0x0;
    }
    lVar3 = 0;
    bVar4 = true;
    do {
      bVar2 = bVar4;
      if (PVar1 == '\x01' && keep_best != 0) {
LAB_001a64bf:
        av1_free_pmc(pc_tree->vertical[lVar3],num_planes);
        pc_tree->vertical[lVar3] = (PICK_MODE_CONTEXT *)0x0;
      }
      else {
        av1_free_pmc(pc_tree->horizontal[lVar3],num_planes);
        pc_tree->horizontal[lVar3] = (PICK_MODE_CONTEXT *)0x0;
        if (PVar1 != '\x02' || keep_best == 0) goto LAB_001a64bf;
      }
      lVar3 = 1;
      bVar4 = false;
    } while (bVar2);
    bVar4 = keep_best == 0;
    lVar3 = -3;
    do {
      if (PVar1 == '\x04' && !bVar4) {
LAB_001a6544:
        av1_free_pmc(pc_tree->verticala[lVar3],num_planes);
        pc_tree->verticala[lVar3] = (PICK_MODE_CONTEXT *)0x0;
        if (PVar1 != '\x06' || bVar4) goto LAB_001a655e;
LAB_001a6578:
        av1_free_pmc(pc_tree->horizontal4[lVar3],num_planes);
        pc_tree->horizontal4[lVar3] = (PICK_MODE_CONTEXT *)0x0;
      }
      else {
        av1_free_pmc(pc_tree->horizontalb[lVar3],num_planes);
        pc_tree->horizontalb[lVar3] = (PICK_MODE_CONTEXT *)0x0;
        if (PVar1 != '\x05' || bVar4) goto LAB_001a6544;
LAB_001a655e:
        av1_free_pmc(pc_tree->verticalb[lVar3],num_planes);
        pc_tree->verticalb[lVar3] = (PICK_MODE_CONTEXT *)0x0;
        if (PVar1 != '\a' || bVar4) goto LAB_001a6578;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    lVar3 = -4;
    do {
      if (PVar1 == '\b' && keep_best != 0) {
LAB_001a65e7:
        av1_free_pmc((PICK_MODE_CONTEXT *)pc_tree->split[lVar3],num_planes);
        pc_tree->split[lVar3] = (PC_TREE *)0x0;
      }
      else {
        av1_free_pmc(pc_tree->vertical4[lVar3],num_planes);
        pc_tree->vertical4[lVar3] = (PICK_MODE_CONTEXT *)0x0;
        if (PVar1 != '\t' || keep_best == 0) goto LAB_001a65e7;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
    if (PVar1 != '\x03' || keep_best == 0) {
      lVar3 = 0;
      do {
        if (pc_tree->split[lVar3] != (PC_TREE *)0x0) {
          av1_free_pc_tree_recursive(pc_tree->split[lVar3],num_planes,0,0,partition_search_type);
          pc_tree->split[lVar3] = (PC_TREE *)0x0;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
    }
    if (keep_none != 0 || keep_best != 0) {
      return;
    }
  }
  aom_free(pc_tree);
  return;
}

Assistant:

void av1_free_pc_tree_recursive(PC_TREE *pc_tree, int num_planes, int keep_best,
                                int keep_none,
                                PARTITION_SEARCH_TYPE partition_search_type) {
  if (pc_tree == NULL) return;

  // Avoid freeing of extended partitions as they are not supported when
  // partition_search_type is VAR_BASED_PARTITION.
  if (partition_search_type == VAR_BASED_PARTITION && !keep_best &&
      !keep_none) {
    FREE_PMC_NODE(pc_tree->none);

    for (int i = 0; i < 2; ++i) {
      FREE_PMC_NODE(pc_tree->horizontal[i]);
      FREE_PMC_NODE(pc_tree->vertical[i]);
    }

#if !defined(NDEBUG) && !CONFIG_REALTIME_ONLY
    for (int i = 0; i < 3; ++i) {
      assert(pc_tree->horizontala[i] == NULL);
      assert(pc_tree->horizontalb[i] == NULL);
      assert(pc_tree->verticala[i] == NULL);
      assert(pc_tree->verticalb[i] == NULL);
    }
    for (int i = 0; i < 4; ++i) {
      assert(pc_tree->horizontal4[i] == NULL);
      assert(pc_tree->vertical4[i] == NULL);
    }
#endif

    for (int i = 0; i < 4; ++i) {
      if (pc_tree->split[i] != NULL) {
        av1_free_pc_tree_recursive(pc_tree->split[i], num_planes, 0, 0,
                                   partition_search_type);
        pc_tree->split[i] = NULL;
      }
    }
    aom_free(pc_tree);
    return;
  }

  const PARTITION_TYPE partition = pc_tree->partitioning;

  if (!keep_none && (!keep_best || (partition != PARTITION_NONE)))
    FREE_PMC_NODE(pc_tree->none);

  for (int i = 0; i < 2; ++i) {
    if (!keep_best || (partition != PARTITION_HORZ))
      FREE_PMC_NODE(pc_tree->horizontal[i]);
    if (!keep_best || (partition != PARTITION_VERT))
      FREE_PMC_NODE(pc_tree->vertical[i]);
  }
#if !CONFIG_REALTIME_ONLY
  for (int i = 0; i < 3; ++i) {
    if (!keep_best || (partition != PARTITION_HORZ_A))
      FREE_PMC_NODE(pc_tree->horizontala[i]);
    if (!keep_best || (partition != PARTITION_HORZ_B))
      FREE_PMC_NODE(pc_tree->horizontalb[i]);
    if (!keep_best || (partition != PARTITION_VERT_A))
      FREE_PMC_NODE(pc_tree->verticala[i]);
    if (!keep_best || (partition != PARTITION_VERT_B))
      FREE_PMC_NODE(pc_tree->verticalb[i]);
  }
  for (int i = 0; i < 4; ++i) {
    if (!keep_best || (partition != PARTITION_HORZ_4))
      FREE_PMC_NODE(pc_tree->horizontal4[i]);
    if (!keep_best || (partition != PARTITION_VERT_4))
      FREE_PMC_NODE(pc_tree->vertical4[i]);
  }
#endif
  if (!keep_best || (partition != PARTITION_SPLIT)) {
    for (int i = 0; i < 4; ++i) {
      if (pc_tree->split[i] != NULL) {
        av1_free_pc_tree_recursive(pc_tree->split[i], num_planes, 0, 0,
                                   partition_search_type);
        pc_tree->split[i] = NULL;
      }
    }
  }

  if (!keep_best && !keep_none) aom_free(pc_tree);
}